

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

expected<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::crate::CrateReader::GetFieldValuePair
          (expected<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CrateReader *this,FieldValuePairVector *fvs,string *name,
          string *tyname)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppVar2;
  size_t __n;
  vtable_type *pvVar3;
  size_type sVar4;
  int iVar5;
  long *plVar6;
  long *plVar7;
  ulong *puVar8;
  pointer ppVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong *local_f0;
  ulong local_e0;
  long lStack_d8;
  string local_d0;
  ulong *local_b0;
  undefined8 local_a8;
  ulong local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppVar9 = (fvs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (fvs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar10 = ppVar9 == ppVar2;
    if (bVar10) {
LAB_001d5953:
      ::std::operator+(&local_50,"FieldValuePair not found with name: `",name);
      plVar6 = (long *)::std::__cxx11::string::append((char *)&local_50);
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_80 = *plVar7;
        lStack_78 = plVar6[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar7;
        local_90 = (long *)*plVar6;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)::std::__cxx11::string::_M_append
                                 ((char *)&local_90,(ulong)(tyname->_M_dataplus)._M_p);
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_60 = *plVar7;
        lStack_58 = plVar6[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar7;
        local_70 = (long *)*plVar6;
      }
      local_68 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)::std::__cxx11::string::append((char *)&local_70);
      puVar8 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar8) {
        local_e0 = *puVar8;
        lStack_d8 = plVar6[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *puVar8;
        local_f0 = (ulong *)*plVar6;
      }
      local_a0 = local_e0;
      sVar4 = plVar6[1];
      *plVar6 = (long)puVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_f0 == &local_e0) {
        lStack_98 = lStack_d8;
        local_b0 = &local_a0;
      }
      else {
        local_b0 = local_f0;
      }
      local_e0 = local_e0 & 0xffffffffffffff00;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = false;
      paVar1 = &(__return_storage_ptr__->contained).
                super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0.m_value.first.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&(__return_storage_ptr__->contained).
            super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0 = paVar1;
      if (local_b0 == &local_a0) {
        paVar1->_M_allocated_capacity = local_a0;
        *(long *)((long)&(__return_storage_ptr__->contained).
                         super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0.m_value.first.field_2 + 8) = lStack_98;
      }
      else {
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.first._M_dataplus._M_p = (pointer)local_b0;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.first.field_2._M_allocated_capacity = local_a0;
      }
      (__return_storage_ptr__->contained).
      super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.first._M_string_length = sVar4;
      local_a0 = local_a0 & 0xffffffffffffff00;
      local_a8 = 0;
      local_b0 = &local_a0;
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      return __return_storage_ptr__;
    }
    __n = (ppVar9->first)._M_string_length;
    if (__n == name->_M_string_length) {
      if (__n == 0) {
        bVar11 = true;
      }
      else {
        iVar5 = bcmp((ppVar9->first)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n);
        bVar11 = iVar5 == 0;
      }
    }
    else {
      bVar11 = false;
    }
    if (bVar11) {
      pvVar3 = (ppVar9->second).value_.v_.vtable;
      if (pvVar3 == (vtable_type *)0x0) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        local_d0.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
        local_d0._M_string_length = 4;
        local_d0.field_2._M_allocated_capacity._4_4_ =
             local_d0.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
      }
      else {
        (*pvVar3->type_name)(&local_d0);
      }
      if (local_d0._M_string_length != tyname->_M_string_length) goto LAB_001d5902;
      if (local_d0._M_string_length == 0) {
        bVar12 = true;
      }
      else {
        iVar5 = bcmp(local_d0._M_dataplus._M_p,(tyname->_M_dataplus)._M_p,local_d0._M_string_length)
        ;
        bVar12 = iVar5 == 0;
      }
    }
    else {
LAB_001d5902:
      bVar12 = false;
    }
    if ((bVar11) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2)) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT44(local_d0.field_2._M_allocated_capacity._4_4_,
                               local_d0.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (bVar12) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>
      ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>
              *)__return_storage_ptr__,ppVar9);
      if (!bVar10) {
        return __return_storage_ptr__;
      }
      goto LAB_001d5953;
    }
    ppVar9 = ppVar9 + 1;
  } while( true );
}

Assistant:

nonstd::expected<FieldValuePair, std::string>
CrateReader::GetFieldValuePair(const FieldValuePairVector &fvs,
                               const std::string &name,
                               const std::string &tyname) {
  for (const auto &fv : fvs) {
    if ((fv.first == name) && (fv.second.type_name() == tyname)) {
      return fv;
    }
  }

  return nonstd::make_unexpected("FieldValuePair not found with name: `" +
                                 name + "` and specified type: `" + tyname +
                                 "`");
}